

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O1

void helper_pcmpgtq_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s)

{
  d->_q_ZMMReg[0] = -(ulong)((long)s->_q_ZMMReg[0] < (long)d->_q_ZMMReg[0]);
  d->_q_ZMMReg[1] = -(ulong)((long)s->_q_ZMMReg[1] < (long)d->_q_ZMMReg[1]);
  return;
}

Assistant:

static inline int pcmp_elen(CPUX86State *env, int reg, uint32_t ctrl)
{
    int val;

    /* Presence of REX.W is indicated by a bit higher than 7 set */
    if (ctrl >> 8) {
        val = abs1((int64_t)env->regs[reg]);
    } else {
        val = abs1((int32_t)env->regs[reg]);
    }

    if (ctrl & 1) {
        if (val > 8) {
            return 8;
        }
    } else {
        if (val > 16) {
            return 16;
        }
    }
    return val;
}